

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O2

void __thiscall half::half(half *this,float f)

{
  unsigned_short uVar1;
  
  if ((f != 0.0) || (NAN(f))) {
    if (_eLut[(uint)f >> 0x17] == 0) {
      uVar1 = convert((int)f);
    }
    else {
      uVar1 = _eLut[(uint)f >> 0x17] +
              (short)(((uint)f & 0x7fffff) + 0xfff + (uint)(((uint)f >> 0xd & 1) != 0) >> 0xd);
    }
  }
  else {
    uVar1 = (unsigned_short)((uint)f >> 0x10);
  }
  this->_h = uVar1;
  return;
}

Assistant:

inline
half::half (float f)
{
    uif x;

    x.f = f;

    if (f == 0)
    {
	//
	// Common special case - zero.
	// Preserve the zero's sign bit.
	//

	_h = (x.i >> 16);
    }
    else
    {
	//
	// We extract the combined sign and exponent, e, from our
	// floating-point number, f.  Then we convert e to the sign
	// and exponent of the half number via a table lookup.
	//
	// For the most common case, where a normalized half is produced,
	// the table lookup returns a non-zero value; in this case, all
	// we have to do is round f's significand to 10 bits and combine
	// the result with e.
	//
	// For all other cases (overflow, zeroes, denormalized numbers
	// resulting from underflow, infinities and NANs), the table
	// lookup returns zero, and we call a longer, non-inline function
	// to do the float-to-half conversion.
	//

	int e = (x.i >> 23) & 0x000001ff;

	e = _eLut[e];

	if (e)
	{
	    //
	    // Simple case - round the significand, m, to 10
	    // bits and combine it with the sign and exponent.
	    //

	    int m = x.i & 0x007fffff;
	    _h = (unsigned short) (e + ((m + 0x00000fff + ((m >> 13) & 1)) >> 13));
	}
	else
	{
	    //
	    // Difficult case - call a function.
	    //

	    _h = convert (x.i);
	}
    }
}